

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.cpp
# Opt level: O2

void reset_percepts(void)

{
  pg.p.scream = false;
  pg.p.wumpus = false;
  pg.p.stench = false;
  pg.p.breeze = false;
  pg.p.glitter = false;
  pg.p.bump = false;
  return;
}

Assistant:

void reset_percepts(){

  pg.p.scream=false;
  pg.p.wumpus=false;
  pg.p.glitter=false;
  pg.p.stench=false;
  pg.p.breeze=false;
  pg.p.bump=false;
}